

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

int Ssw_RarSimulate(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ssw_RarMan_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Abc_Cex_t *pAVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  char *format;
  uint uVar13;
  Ssw_RarMan_t *pSVar14;
  Ssw_RarMan_t *__ptr;
  ulong in_R8;
  uint uVar15;
  int local_6c;
  int local_68;
  uint local_64;
  timespec ts;
  Ssw_RarMan_t *local_38;
  
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  iVar2 = pPars->TimeOut;
  if ((long)iVar2 == 0) {
    lVar9 = 0;
  }
  else {
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar9 = lVar9 + (long)iVar2 * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3da,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nConstrs != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3db,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  uVar15 = pPars->nRandSeed;
  local_38 = (Ssw_RarMan_t *)(ulong)uVar15;
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  if (pPars->fVerbose != 0) {
    in_R8 = (ulong)(uint)pPars->nRounds;
    Abc_Print(pPars->nRandSeed,
              "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n"
              ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,in_R8,
              (ulong)(uint)pPars->nRestart,(ulong)(uint)pPars->nRandSeed,(ulong)(uint)pPars->TimeOut
             );
  }
  Ssw_RarManPrepareRandom(uVar15);
  p = Ssw_RarManStart(pAig,pPars);
  lVar11 = (long)pPars->nWords * (long)pAig->nRegs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar2 = (int)lVar11;
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  pVVar5->nCap = iVar3;
  if (iVar3 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar5->pArray = piVar6;
  pVVar5->nSize = iVar2;
  memset(piVar6,0,lVar11 * 4);
  p->vInits = pVVar5;
  pPars->nSolved = 0;
  pSVar14 = (Ssw_RarMan_t *)0x3;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  uVar15 = 0xffffffff;
  local_64 = 0;
  local_68 = -1;
  local_6c = 0;
  while( true ) {
    iVar2 = (int)pSVar14;
    if ((pPars->nRounds != 0) && (pPars->nRounds <= (int)(pPars->nRestart * local_64 + local_6c)))
    break;
    clock_gettime(3,(timespec *)&ts);
    iVar3 = (int)local_38;
    if (pPars->nFrames < 1) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      do {
        if (uVar15 == 0) {
          pVVar5 = p->vInits;
        }
        else {
          pVVar5 = (Vec_Int_t *)0x0;
        }
        Ssw_RarManSimulate(p,pVVar5,0,0);
        iVar2 = p->pPars->nFrames;
        iVar4 = clock_gettime(3,(timespec *)&ts);
        if (iVar4 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        pSVar14 = p;
        iVar4 = Ssw_RarManCheckNonConstOutputs(p,iVar2 * local_6c + uVar15,lVar10 - lVar8);
        uVar13 = (uint)in_R8;
        iVar2 = (int)pSVar14;
        if (iVar4 == 1) {
          if (pPars->fSolveAll == 0) {
            if (pPars->fVerbose != 0) {
              Abc_Print(iVar2,"\n");
            }
            Ssw_RarManPrepareRandom(iVar3);
            if (pPars->fVerbose != 0) {
              uVar13 = local_64;
              Abc_Print(iVar3,"Simulated %d frames for %d rounds with %d restarts.\n",
                        (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + local_6c));
            }
            pSVar14 = p;
            pAVar7 = Ssw_RarDeriveCex(p,p->pPars->nFrames * local_6c + uVar15,p->iFailPo,p->iFailPat
                                      ,uVar13);
            pAig->pSeqModel = pAVar7;
            local_68 = 0;
            Abc_Print((int)pSVar14,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)pAVar7->iPo,pAig->pName,(ulong)(uint)pAVar7->iFrame);
            iVar2 = 3;
            iVar3 = clock_gettime(3,(timespec *)&ts);
            if (iVar3 < 0) {
              lVar9 = -1;
            }
            else {
              lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar2,"%s =","Time");
            Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar9 - lVar8) / 1000000.0);
            goto LAB_005f20b8;
          }
          iVar2 = 3;
          iVar4 = clock_gettime(3,(timespec *)&ts);
          if (iVar4 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          local_68 = 0;
        }
        else if (iVar4 == 2) {
          Abc_Print(iVar2,"Quitting due to callback on fail.\n");
          goto LAB_005f20b8;
        }
        if (pPars->TimeOut != 0) {
          iVar2 = 3;
          iVar4 = clock_gettime(3,(timespec *)&ts);
          if (iVar4 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if (lVar10 <= lVar9) goto LAB_005f1bf0;
          if (pPars->fSilent == 0) {
            if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
              Abc_Print(iVar2,"\n");
            }
            Abc_Print(iVar2,
                      "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                      (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + local_6c),
                      (ulong)local_64,(ulong)(uint)pPars->nSolved);
            uVar13 = pPars->TimeOut;
            format = "Reached timeout (%d sec).\n";
LAB_005f206f:
            Abc_Print(iVar2,format,(ulong)uVar13);
          }
          goto LAB_005f20b8;
        }
LAB_005f1bf0:
        if ((pPars->TimeOutGap != 0) && (lVar11 != 0)) {
          iVar2 = 3;
          iVar4 = clock_gettime(3,(timespec *)&ts);
          if (iVar4 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if ((long)pPars->TimeOutGap * 1000000 + lVar11 < lVar10) {
            if (pPars->fSilent == 0) {
              if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
                Abc_Print(iVar2,"\n");
              }
              Abc_Print(iVar2,
                        "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  "
                        ,(ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + local_6c),
                        (ulong)local_64,(ulong)(uint)pPars->nSolved);
              uVar13 = pPars->TimeOutGap;
              format = "Reached gap timeout (%d sec).\n";
              goto LAB_005f206f;
            }
            goto LAB_005f20b8;
          }
        }
        if ((pPars->fSolveAll != 0) && (pVVar1 = p->vCexes, pVVar1 != (Vec_Ptr_t *)0x0)) {
          if ((long)pVVar1->nSize < 1) goto LAB_005f20b8;
          lVar10 = 0;
          iVar4 = 0;
          do {
            iVar4 = iVar4 + (uint)(pVVar1->pArray[lVar10] == (void *)0x0);
            lVar10 = lVar10 + 1;
          } while (pVVar1->nSize != lVar10);
          if (iVar4 == 0) goto LAB_005f20b8;
        }
        uVar15 = uVar15 + 1;
      } while ((int)uVar15 < pPars->nFrames);
    }
    if (local_6c == pPars->nRestart && pPars->nRestart != 0) {
      uVar13 = (iVar3 + 1) % 1000;
      local_38 = (Ssw_RarMan_t *)(ulong)uVar13;
      pSVar14 = local_38;
      Ssw_RarManPrepareRandom(uVar13);
      pVVar5 = p->vInits;
      uVar12 = (long)pPars->nWords * (long)pAig->nRegs;
      iVar2 = (int)uVar12;
      if (pVVar5->nCap < iVar2) {
        __ptr = (Ssw_RarMan_t *)pVVar5->pArray;
        pSVar14 = (Ssw_RarMan_t *)(uVar12 * 4);
        if (__ptr == (Ssw_RarMan_t *)0x0) {
          piVar6 = (int *)malloc((size_t)pSVar14);
        }
        else {
          piVar6 = (int *)realloc(__ptr,(size_t)pSVar14);
          pSVar14 = __ptr;
        }
        pVVar5->pArray = piVar6;
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar5->nCap = iVar2;
      }
      if (0 < iVar2) {
        pSVar14 = (Ssw_RarMan_t *)pVVar5->pArray;
        memset(pSVar14,0,(uVar12 & 0xffffffff) << 2);
      }
      pVVar5->nSize = iVar2;
      local_64 = local_64 + 1;
      p->vPatBests->nSize = 0;
      local_6c = -1;
    }
    else {
      pSVar14 = p;
      Ssw_RarTransferPatterns(p,p->vInits);
    }
    iVar2 = (int)pSVar14;
    if (pPars->fVerbose != 0) {
      if (pPars->fSolveAll == 0) {
        Abc_Print(iVar2,".");
      }
      else {
        Abc_Print(iVar2,"Starts =%6d   ",(ulong)local_64);
        iVar3 = local_6c;
        if (local_6c == -1) {
          iVar3 = 0;
        }
        Abc_Print(iVar2,"Rounds =%6d   ",(ulong)(iVar3 + pPars->nRestart * local_64));
        Abc_Print(iVar2,"Frames =%6d   ",
                  (ulong)((pPars->nRestart * local_64 + local_6c) * pPars->nFrames));
        Abc_Print(iVar2,"CEX =%6d (%6.2f %%)   ",
                  ((double)pPars->nSolved * 100.0) / (double)p->pAig->nTruePos);
        pSVar14 = (Ssw_RarMan_t *)0x3;
        iVar2 = clock_gettime(3,(timespec *)&ts);
        if (iVar2 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print((int)pSVar14,"%s =","Time");
        Abc_Print((int)pSVar14,"%9.2f sec\n",(double)(lVar10 - lVar8) / 1000000.0);
      }
    }
    local_6c = local_6c + 1;
  }
LAB_005f20b8:
  if ((pPars->fSetLastState != 0) && (pVVar5 = p->vInits, pVVar5 != (Vec_Int_t *)0x0)) {
    iVar2 = pAig->nRegs;
    if (pVVar5->nSize % iVar2 != 0) {
      __assert_fail("Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x455,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    if (pVVar5->nSize < iVar2) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar5->nSize = iVar2;
    pAig->pData = pVVar5;
    p->vInits = (Vec_Int_t *)0x0;
  }
  if ((((pPars->nSolved == 0) && (local_6c == pPars->nRounds)) && (uVar15 == pPars->nFrames)) &&
     (pPars->fSilent == 0)) {
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar2,"\n");
      uVar15 = pPars->nFrames;
    }
    Abc_Print(iVar2,"Simulation of %d frames for %d rounds with %d restarts did not assert POs.    "
              ,(ulong)uVar15,(ulong)(pPars->nRestart * local_64 + local_6c));
    iVar3 = 3;
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%s =","Time");
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar9 - lVar8) / 1000000.0);
  }
  Ssw_RarManStop(p);
  return local_68;
}

Assistant:

int Ssw_RarSimulate( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    int fTryBmc = 0;
    int fMiter = 1;
    Ssw_RarMan_t * p;
    int r, f = -1;
    abctime clk, clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime timeLastSolved = 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    int iFrameFail = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    ABC_FREE( pAig->pSeqModel );
    // consider the case of empty AIG
//    if ( Aig_ManNodeNum(pAig) == 0 )
//        return -1;
    // check trivially SAT miters
//    if ( fMiter && Ssw_RarCheckTrivial( pAig, fVerbose ) )
//        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRestart, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) * pPars->nWords );

    // perform simulation rounds
    pPars->nSolved = 0;
    timeLastSolved = Abc_Clock();
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        clk = Abc_Clock();
        if ( fTryBmc )
        {
            Aig_Man_t * pNewAig = Saig_ManDupWithPhase( pAig, p->vInits );
            Saig_BmcPerform( pNewAig, 0, 100, 2000, 3, 0, 0, 1 /*fVerbose*/, 0, &iFrameFail, 0 );
//            if ( pNewAig->pSeqModel != NULL )
//                Abc_Print( 1, "BMC has found a counter-example in frame %d.\n", iFrameFail );
            Aig_ManStop( pNewAig );
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 0, 0 );
            if ( fMiter )
            {
                int Status = Ssw_RarManCheckNonConstOutputs(p, r * p->pPars->nFrames + f, Abc_Clock() - clkTotal);
                if ( Status == 2 )
                {
                    Abc_Print( 1, "Quitting due to callback on fail.\n" );
                    goto finish;
                }
                if ( Status == 1 ) // found CEX
                {
                    RetValue = 0;
                    if ( !pPars->fSolveAll )
                    {
                        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        //                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * nFrames, (r+1) * nFrames );
                        Ssw_RarManPrepareRandom( nSavedSeed );
                        if ( pPars->fVerbose )
                            Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                        pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, pPars->fVerbose );
                        // print final report
                        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                        goto finish;
                    }
                    timeLastSolved = Abc_Clock();
                }
                // else - did not find a counter example
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                }
                goto finish;
            }
            if ( pPars->TimeOutGap && timeLastSolved && Abc_Clock() > timeLastSolved + pPars->TimeOutGap * CLOCKS_PER_SEC )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached gap timeout (%d sec).\n",  pPars->TimeOutGap );
                }
                goto finish;
            }
            // check if all outputs are solved by now
            if ( pPars->fSolveAll && p->vCexes && Vec_PtrCountZero(p->vCexes) == 0 )
                goto finish;
        }
        // get initialization patterns
        if ( pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            if ( pPars->fSolveAll )
            {
                Abc_Print( 1, "Starts =%6d   ",  nNumRestart );
                Abc_Print( 1, "Rounds =%6d   ",  nNumRestart * pPars->nRestart + ((r==-1)?0:r) );
                Abc_Print( 1, "Frames =%6d   ", (nNumRestart * pPars->nRestart + r) * pPars->nFrames );
                Abc_Print( 1, "CEX =%6d (%6.2f %%)   ", pPars->nSolved, 100.0*pPars->nSolved/Saig_ManPoNum(p->pAig) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
            }
            else
                Abc_Print( 1, "." );
        }

    }
finish:
    if ( pPars->fSetLastState && p->vInits )
    {
        assert( Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0 );
        Vec_IntShrink( p->vInits, Aig_ManRegNum(pAig) );
        pAig->pData = p->vInits;  p->vInits = NULL;
    }
    if ( pPars->nSolved )
    {
/*
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts asserted %d (out of %d) POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved, Saig_ManPoNum(p->pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
*/
    }
    else if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}